

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_16bit_4chan_interleave(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  void *pvVar4;
  int iVar5;
  int y;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint64_t *outall;
  uint8_t *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  iVar6 = decode->user_line_begin_skip;
  iVar5 = (decode->chunk).height - decode->user_line_end_ignore;
  if (iVar6 < iVar5) {
    peVar3 = decode->channels;
    pvVar4 = decode->unpacked_buffer;
    uVar1 = peVar3->width;
    lVar8 = (long)(int)(uVar1 * 8);
    lVar7 = (long)(int)(uVar1 * 8 * iVar6);
    lVar9 = (long)pvVar4 + lVar7;
    puVar10 = (peVar3->field_12).decode_to_ptr;
    iVar2 = peVar3->user_line_stride;
    lVar13 = (long)(int)uVar1;
    lVar11 = lVar7 + lVar13 * 6 + (long)pvVar4;
    lVar12 = lVar7 + lVar13 * 4 + (long)pvVar4;
    lVar7 = lVar7 + lVar13 * 2 + (long)pvVar4;
    do {
      if (0 < (int)uVar1) {
        lVar13 = 0;
        do {
          *(ulong *)(puVar10 + lVar13 * 4) =
               CONCAT26(*(undefined2 *)(lVar11 + lVar13),
                        CONCAT24(*(undefined2 *)(lVar12 + lVar13),
                                 CONCAT22(*(undefined2 *)(lVar7 + lVar13),
                                          *(undefined2 *)(lVar9 + lVar13))));
          lVar13 = lVar13 + 2;
        } while ((ulong)uVar1 * 2 != lVar13);
      }
      lVar9 = lVar9 + lVar8;
      puVar10 = puVar10 + iVar2;
      iVar6 = iVar6 + 1;
      lVar11 = lVar11 + lVar8;
      lVar12 = lVar12 + lVar8;
      lVar7 = lVar7 + lVar8;
    } while (iVar6 < iVar5);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;
    /* TODO: can do this with sse and do 2 outpixels at once */
    union
    {
        struct
        {
            uint16_t a;
            uint16_t b;
            uint16_t g;
            uint16_t r;
        };
        uint64_t allc;
    } combined;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 8;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        uint64_t* outall = (uint64_t*) out0;
        in0              = (const uint16_t*) srcbuffer;
        in1              = in0 + w;
        in2              = in1 + w;
        in3              = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            combined.a = one_to_native16 (in0[x]);
            combined.b = one_to_native16 (in1[x]);
            combined.g = one_to_native16 (in2[x]);
            combined.r = one_to_native16 (in3[x]);
            outall[x]  = combined.allc;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}